

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

int recode_loop_test(AV1_COMP *cpi,int high_limit,int low_limit,int q,int maxq,int minq)

{
  int iVar1;
  AV1_COMP *cpi_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int force_recode;
  int frame_is_kfgfarf;
  AV1EncoderConfig *oxcf;
  RATE_CONTROL *rc;
  int local_38;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x42320);
  iVar1 = frame_is_kf_gf_arf(cpi_00);
  local_38 = 0;
  if (((*(int *)(in_RDI + 0x607fc) <= *(int *)(in_RDI + 0x60778)) ||
      (*(char *)(in_RDI + 0x608c4) == '\x02')) ||
     ((iVar1 != 0 && (*(char *)(in_RDI + 0x608c4) == '\x01')))) {
    if (((in_ESI < *(int *)(in_RDI + 0x60778)) && (in_ECX < in_R8D)) ||
       ((*(int *)(in_RDI + 0x60778) < in_EDX && (in_R9D < in_ECX)))) {
      local_38 = 1;
    }
    else if (((*(int *)(in_RDI + 0x423dc) == 2) &&
             (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[10] + 4) < in_ECX)) &&
            ((long)*(int *)(in_RDI + 0x60778) < (long)*(int *)(in_RDI + 0x60774) * 7 >> 3)) {
      local_38 = 1;
    }
  }
  return local_38;
}

Assistant:

static inline int recode_loop_test(AV1_COMP *cpi, int high_limit, int low_limit,
                                   int q, int maxq, int minq) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const int frame_is_kfgfarf = frame_is_kf_gf_arf(cpi);
  int force_recode = 0;

  if ((rc->projected_frame_size >= rc->max_frame_bandwidth) ||
      (cpi->sf.hl_sf.recode_loop == ALLOW_RECODE) ||
      (frame_is_kfgfarf &&
       (cpi->sf.hl_sf.recode_loop == ALLOW_RECODE_KFARFGF))) {
    // TODO(agrange) high_limit could be greater than the scale-down threshold.
    if ((rc->projected_frame_size > high_limit && q < maxq) ||
        (rc->projected_frame_size < low_limit && q > minq)) {
      force_recode = 1;
    } else if (cpi->oxcf.rc_cfg.mode == AOM_CQ) {
      // Deal with frame undershoot and whether or not we are
      // below the automatically set cq level.
      if (q > oxcf->rc_cfg.cq_level &&
          rc->projected_frame_size <
              (((int64_t)rc->this_frame_target * 7) >> 3)) {
        force_recode = 1;
      }
    }
  }
  return force_recode;
}